

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMsg * curl_multi_info_read(Curl_multi *multi,int *msgs_in_queue)

{
  int iVar1;
  size_t sVar2;
  Curl_llist_node *n;
  void *pvVar3;
  Curl_llist *list;
  
  *msgs_in_queue = 0;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) && ((multi->field_0x279 & 4) == 0)
     ) {
    list = &multi->msglist;
    sVar2 = Curl_llist_count(list);
    if (sVar2 != 0) {
      n = Curl_llist_head(list);
      pvVar3 = Curl_node_elem(n);
      Curl_node_remove(n);
      sVar2 = Curl_llist_count(list);
      iVar1 = curlx_uztosi(sVar2);
      *msgs_in_queue = iVar1;
      return (CURLMsg *)((long)pvVar3 + 0x20);
    }
  }
  return (CURLMsg *)0x0;
}

Assistant:

CURLMsg *curl_multi_info_read(struct Curl_multi *multi, int *msgs_in_queue)
{
  struct Curl_message *msg;

  *msgs_in_queue = 0; /* default to none */

  if(GOOD_MULTI_HANDLE(multi) &&
     !multi->in_callback &&
     Curl_llist_count(&multi->msglist)) {
    /* there is one or more messages in the list */
    struct Curl_llist_node *e;

    /* extract the head of the list to return */
    e = Curl_llist_head(&multi->msglist);

    msg = Curl_node_elem(e);

    /* remove the extracted entry */
    Curl_node_remove(e);

    *msgs_in_queue = curlx_uztosi(Curl_llist_count(&multi->msglist));

    return &msg->extmsg;
  }
  return NULL;
}